

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_sd_right_to_left_weighted<double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (double *x,double xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w,double *cumw)

{
  unsigned_long *key;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar7;
  double local_68;
  
  key = ix_arr + end;
  dVar3 = 0.0;
  dVar6 = 0.0;
  dVar5 = 0.0;
  lVar1 = 0;
  local_68 = x[*key] - xmean;
  while( true ) {
    if (st - end == lVar1) break;
    pVar7 = tsl::detail_robin_hash::
            robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
            ::try_emplace<unsigned_long_const&>
                      ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                        *)w,key);
    dVar2 = *(double *)((pVar7.first.m_bucket.m_bucket)->m_value + 8);
    dVar5 = dVar5 + dVar2;
    dVar4 = x[*key] - xmean;
    dVar6 = dVar6 + ((dVar4 - dVar6) * dVar2) / dVar5;
    dVar3 = dVar3 + (dVar4 - local_68) * (dVar4 - dVar6) * dVar2;
    dVar2 = 0.0;
    if (lVar1 != 0) {
      dVar2 = SQRT(dVar3 / dVar5);
    }
    sd_arr[(end + lVar1) - st] = dVar2;
    key = key + -1;
    lVar1 = lVar1 + -1;
    local_68 = dVar6;
  }
  pVar7 = tsl::detail_robin_hash::
          robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
          ::try_emplace<unsigned_long_const&>
                    ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                      *)w,ix_arr + st);
  dVar2 = *(double *)((pVar7.first.m_bucket.m_bucket)->m_value + 8);
  dVar5 = dVar5 + dVar2;
  dVar4 = x[ix_arr[st]] - xmean;
  *cumw = dVar5;
  return SQRT(((dVar4 - local_68) * (dVar4 - ((dVar4 - dVar6) / dVar5 + dVar6)) * dVar2 + dVar3) /
              dVar5);
}

Assistant:

ldouble_safe calc_sd_right_to_left_weighted(real_t_ *restrict x, real_t_ xmean, size_t ix_arr[], size_t st, size_t end,
                                           double *restrict sd_arr, mapping &restrict w, ldouble_safe &cumw)
{
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    real_t_ mean_prev = x[ix_arr[end]] - xmean;
    size_t n = end - st + 1;
    ldouble_safe cnt = 0;
    double w_this;
    for (size_t row = 0; row < n-1; row++)
    {
        w_this = w[ix_arr[end-row]];
        cnt += w_this;
        running_mean   += w_this * ((x[ix_arr[end-row]] - xmean) - running_mean) / cnt;
        running_ssq    += w_this * (((x[ix_arr[end-row]] - xmean) - running_mean) * ((x[ix_arr[end-row]] - xmean) - mean_prev));
        mean_prev       =  running_mean;
        sd_arr[n-row-1] = (row == 0)? 0. : std::sqrt(running_ssq / cnt);
    }
    w_this = w[ix_arr[st]];
    cnt += w_this;
    running_mean   += ((x[ix_arr[st]] - xmean) - running_mean) / cnt;
    running_ssq    += w_this * (((x[ix_arr[st]] - xmean) - running_mean) * ((x[ix_arr[st]] - xmean) - mean_prev));
    cumw = cnt;
    return std::sqrt(running_ssq / cnt);
}